

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dwarf.cpp
# Opt level: O0

uint llvm::dwarf::AttributeVersion(Attribute Attribute)

{
  undefined4 local_c;
  Attribute Attribute_local;
  
  if (Attribute == DW_AT_sibling) {
    local_c = 2;
  }
  else if (Attribute == DW_AT_location) {
    local_c = 2;
  }
  else if (Attribute == DW_AT_name) {
    local_c = 2;
  }
  else if (Attribute == DW_AT_ordering) {
    local_c = 2;
  }
  else if (Attribute == DW_AT_byte_size) {
    local_c = 2;
  }
  else if (Attribute == DW_AT_bit_offset) {
    local_c = 2;
  }
  else if (Attribute == DW_AT_bit_size) {
    local_c = 2;
  }
  else if (Attribute == DW_AT_stmt_list) {
    local_c = 2;
  }
  else if (Attribute == DW_AT_low_pc) {
    local_c = 2;
  }
  else if (Attribute == DW_AT_high_pc) {
    local_c = 2;
  }
  else if (Attribute == DW_AT_language) {
    local_c = 2;
  }
  else if (Attribute == DW_AT_discr) {
    local_c = 2;
  }
  else if (Attribute == DW_AT_discr_value) {
    local_c = 2;
  }
  else if (Attribute == DW_AT_visibility) {
    local_c = 2;
  }
  else if (Attribute == DW_AT_import) {
    local_c = 2;
  }
  else if (Attribute == DW_AT_string_length) {
    local_c = 2;
  }
  else if (Attribute == DW_AT_common_reference) {
    local_c = 2;
  }
  else if (Attribute == DW_AT_comp_dir) {
    local_c = 2;
  }
  else if (Attribute == DW_AT_const_value) {
    local_c = 2;
  }
  else if (Attribute == DW_AT_containing_type) {
    local_c = 2;
  }
  else if (Attribute == DW_AT_default_value) {
    local_c = 2;
  }
  else if (Attribute == DW_AT_inline) {
    local_c = 2;
  }
  else if (Attribute == DW_AT_is_optional) {
    local_c = 2;
  }
  else if (Attribute == DW_AT_lower_bound) {
    local_c = 2;
  }
  else if (Attribute == DW_AT_producer) {
    local_c = 2;
  }
  else if (Attribute == DW_AT_prototyped) {
    local_c = 2;
  }
  else if (Attribute == DW_AT_return_addr) {
    local_c = 2;
  }
  else if (Attribute == DW_AT_start_scope) {
    local_c = 2;
  }
  else if (Attribute == DW_AT_bit_stride) {
    local_c = 2;
  }
  else if (Attribute == DW_AT_upper_bound) {
    local_c = 2;
  }
  else if (Attribute == DW_AT_abstract_origin) {
    local_c = 2;
  }
  else if (Attribute == DW_AT_accessibility) {
    local_c = 2;
  }
  else if (Attribute == DW_AT_address_class) {
    local_c = 2;
  }
  else if (Attribute == DW_AT_artificial) {
    local_c = 2;
  }
  else if (Attribute == DW_AT_base_types) {
    local_c = 2;
  }
  else if (Attribute == DW_AT_calling_convention) {
    local_c = 2;
  }
  else if (Attribute == DW_AT_count) {
    local_c = 2;
  }
  else if (Attribute == DW_AT_data_member_location) {
    local_c = 2;
  }
  else if (Attribute == DW_AT_decl_column) {
    local_c = 2;
  }
  else if (Attribute == DW_AT_decl_file) {
    local_c = 2;
  }
  else if (Attribute == DW_AT_decl_line) {
    local_c = 2;
  }
  else if (Attribute == DW_AT_declaration) {
    local_c = 2;
  }
  else if (Attribute == DW_AT_discr_list) {
    local_c = 2;
  }
  else if (Attribute == DW_AT_encoding) {
    local_c = 2;
  }
  else if (Attribute == DW_AT_external) {
    local_c = 2;
  }
  else if (Attribute == DW_AT_frame_base) {
    local_c = 2;
  }
  else if (Attribute == DW_AT_friend) {
    local_c = 2;
  }
  else if (Attribute == DW_AT_identifier_case) {
    local_c = 2;
  }
  else if (Attribute == DW_AT_macro_info) {
    local_c = 2;
  }
  else if (Attribute == DW_AT_namelist_item) {
    local_c = 2;
  }
  else if (Attribute == DW_AT_priority) {
    local_c = 2;
  }
  else if (Attribute == DW_AT_segment) {
    local_c = 2;
  }
  else if (Attribute == DW_AT_specification) {
    local_c = 2;
  }
  else if (Attribute == DW_AT_static_link) {
    local_c = 2;
  }
  else if (Attribute == DW_AT_type) {
    local_c = 2;
  }
  else if (Attribute == DW_AT_use_location) {
    local_c = 2;
  }
  else if (Attribute == DW_AT_variable_parameter) {
    local_c = 2;
  }
  else if (Attribute == DW_AT_virtuality) {
    local_c = 2;
  }
  else if (Attribute == DW_AT_vtable_elem_location) {
    local_c = 2;
  }
  else if (Attribute == DW_AT_allocated) {
    local_c = 3;
  }
  else if (Attribute == DW_AT_associated) {
    local_c = 3;
  }
  else if (Attribute == DW_AT_data_location) {
    local_c = 3;
  }
  else if (Attribute == DW_AT_byte_stride) {
    local_c = 3;
  }
  else if (Attribute == DW_AT_entry_pc) {
    local_c = 3;
  }
  else if (Attribute == DW_AT_use_UTF8) {
    local_c = 3;
  }
  else if (Attribute == DW_AT_extension) {
    local_c = 3;
  }
  else if (Attribute == DW_AT_ranges) {
    local_c = 3;
  }
  else if (Attribute == DW_AT_trampoline) {
    local_c = 3;
  }
  else if (Attribute == DW_AT_call_column) {
    local_c = 3;
  }
  else if (Attribute == DW_AT_call_file) {
    local_c = 3;
  }
  else if (Attribute == DW_AT_call_line) {
    local_c = 3;
  }
  else if (Attribute == DW_AT_description) {
    local_c = 3;
  }
  else if (Attribute == DW_AT_binary_scale) {
    local_c = 3;
  }
  else if (Attribute == DW_AT_decimal_scale) {
    local_c = 3;
  }
  else if (Attribute == DW_AT_small) {
    local_c = 3;
  }
  else if (Attribute == DW_AT_decimal_sign) {
    local_c = 3;
  }
  else if (Attribute == DW_AT_digit_count) {
    local_c = 3;
  }
  else if (Attribute == DW_AT_picture_string) {
    local_c = 3;
  }
  else if (Attribute == DW_AT_mutable) {
    local_c = 3;
  }
  else if (Attribute == DW_AT_threads_scaled) {
    local_c = 3;
  }
  else if (Attribute == DW_AT_explicit) {
    local_c = 3;
  }
  else if (Attribute == DW_AT_object_pointer) {
    local_c = 3;
  }
  else if (Attribute == DW_AT_endianity) {
    local_c = 3;
  }
  else if (Attribute == DW_AT_elemental) {
    local_c = 3;
  }
  else if (Attribute == DW_AT_pure) {
    local_c = 3;
  }
  else if (Attribute == DW_AT_recursive) {
    local_c = 3;
  }
  else if (Attribute == DW_AT_signature) {
    local_c = 4;
  }
  else if (Attribute == DW_AT_main_subprogram) {
    local_c = 4;
  }
  else if (Attribute == DW_AT_data_bit_offset) {
    local_c = 4;
  }
  else if (Attribute == DW_AT_const_expr) {
    local_c = 4;
  }
  else if (Attribute == DW_AT_enum_class) {
    local_c = 4;
  }
  else if (Attribute == DW_AT_linkage_name) {
    local_c = 4;
  }
  else if (Attribute == DW_AT_string_length_bit_size) {
    local_c = 5;
  }
  else if (Attribute == DW_AT_string_length_byte_size) {
    local_c = 5;
  }
  else if (Attribute == DW_AT_rank) {
    local_c = 5;
  }
  else if (Attribute == DW_AT_str_offsets_base) {
    local_c = 5;
  }
  else if (Attribute == DW_AT_addr_base) {
    local_c = 5;
  }
  else if (Attribute == DW_AT_rnglists_base) {
    local_c = 5;
  }
  else if (Attribute == DW_AT_dwo_id) {
    local_c = 0;
  }
  else if (Attribute == DW_AT_dwo_name) {
    local_c = 5;
  }
  else if (Attribute == DW_AT_reference) {
    local_c = 5;
  }
  else if (Attribute == DW_AT_rvalue_reference) {
    local_c = 5;
  }
  else if (Attribute == DW_AT_macros) {
    local_c = 5;
  }
  else if (Attribute == DW_AT_call_all_calls) {
    local_c = 5;
  }
  else if (Attribute == DW_AT_call_all_source_calls) {
    local_c = 5;
  }
  else if (Attribute == DW_AT_call_all_tail_calls) {
    local_c = 5;
  }
  else if (Attribute == DW_AT_call_return_pc) {
    local_c = 5;
  }
  else if (Attribute == DW_AT_call_value) {
    local_c = 5;
  }
  else if (Attribute == DW_AT_call_origin) {
    local_c = 5;
  }
  else if (Attribute == DW_AT_call_parameter) {
    local_c = 5;
  }
  else if (Attribute == DW_AT_call_pc) {
    local_c = 5;
  }
  else if (Attribute == DW_AT_call_tail_call) {
    local_c = 5;
  }
  else if (Attribute == DW_AT_call_target) {
    local_c = 5;
  }
  else if (Attribute == DW_AT_call_target_clobbered) {
    local_c = 5;
  }
  else if (Attribute == DW_AT_call_data_location) {
    local_c = 5;
  }
  else if (Attribute == DW_AT_call_data_value) {
    local_c = 5;
  }
  else if (Attribute == DW_AT_noreturn) {
    local_c = 5;
  }
  else if (Attribute == DW_AT_alignment) {
    local_c = 5;
  }
  else if (Attribute == DW_AT_export_symbols) {
    local_c = 5;
  }
  else if (Attribute == DW_AT_deleted) {
    local_c = 5;
  }
  else if (Attribute == DW_AT_defaulted) {
    local_c = 5;
  }
  else if (Attribute == DW_AT_loclists_base) {
    local_c = 5;
  }
  else if (Attribute == DW_AT_MIPS_loop_begin) {
    local_c = 0;
  }
  else if (Attribute == DW_AT_MIPS_tail_loop_begin) {
    local_c = 0;
  }
  else if (Attribute == DW_AT_MIPS_epilog_begin) {
    local_c = 0;
  }
  else if (Attribute == DW_AT_MIPS_loop_unroll_factor) {
    local_c = 0;
  }
  else if (Attribute == DW_AT_MIPS_software_pipeline_depth) {
    local_c = 0;
  }
  else if (Attribute == DW_AT_MIPS_linkage_name) {
    local_c = 0;
  }
  else if (Attribute == DW_AT_MIPS_stride) {
    local_c = 0;
  }
  else if (Attribute == DW_AT_MIPS_abstract_name) {
    local_c = 0;
  }
  else if (Attribute == DW_AT_MIPS_clone_origin) {
    local_c = 0;
  }
  else if (Attribute == DW_AT_MIPS_has_inlines) {
    local_c = 0;
  }
  else if (Attribute == DW_AT_MIPS_stride_byte) {
    local_c = 0;
  }
  else if (Attribute == DW_AT_MIPS_stride_elem) {
    local_c = 0;
  }
  else if (Attribute == DW_AT_MIPS_ptr_dopetype) {
    local_c = 0;
  }
  else if (Attribute == DW_AT_MIPS_allocatable_dopetype) {
    local_c = 0;
  }
  else if (Attribute == DW_AT_MIPS_assumed_shape_dopetype) {
    local_c = 0;
  }
  else if (Attribute == DW_AT_MIPS_assumed_size) {
    local_c = 0;
  }
  else if (Attribute == DW_AT_sf_names) {
    local_c = 0;
  }
  else if (Attribute == DW_AT_src_info) {
    local_c = 0;
  }
  else if (Attribute == DW_AT_mac_info) {
    local_c = 0;
  }
  else if (Attribute == DW_AT_src_coords) {
    local_c = 0;
  }
  else if (Attribute == DW_AT_body_begin) {
    local_c = 0;
  }
  else if (Attribute == DW_AT_body_end) {
    local_c = 0;
  }
  else if (Attribute == DW_AT_GNU_vector) {
    local_c = 0;
  }
  else if (Attribute == DW_AT_GNU_odr_signature) {
    local_c = 0;
  }
  else if (Attribute == DW_AT_GNU_template_name) {
    local_c = 0;
  }
  else if (Attribute == DW_AT_GNU_call_site_value) {
    local_c = 0;
  }
  else if (Attribute == DW_AT_GNU_call_site_data_value) {
    local_c = 0;
  }
  else if (Attribute == DW_AT_GNU_call_site_target) {
    local_c = 0;
  }
  else if (Attribute == DW_AT_GNU_call_site_target_clobbered) {
    local_c = 0;
  }
  else if (Attribute == DW_AT_GNU_tail_call) {
    local_c = 0;
  }
  else if (Attribute == DW_AT_GNU_all_tail_call_sites) {
    local_c = 0;
  }
  else if (Attribute == DW_AT_GNU_all_call_sites) {
    local_c = 0;
  }
  else if (Attribute == DW_AT_GNU_all_source_call_sites) {
    local_c = 0;
  }
  else if (Attribute == DW_AT_GNU_macros) {
    local_c = 0;
  }
  else if (Attribute == DW_AT_GNU_dwo_name) {
    local_c = 0;
  }
  else if (Attribute == DW_AT_GNU_dwo_id) {
    local_c = 0;
  }
  else if (Attribute == DW_AT_GNU_ranges_base) {
    local_c = 0;
  }
  else if (Attribute == DW_AT_GNU_addr_base) {
    local_c = 0;
  }
  else if (Attribute == DW_AT_GNU_pubnames) {
    local_c = 0;
  }
  else if (Attribute == DW_AT_GNU_pubtypes) {
    local_c = 0;
  }
  else if (Attribute == DW_AT_GNU_discriminator) {
    local_c = 0;
  }
  else if (Attribute == DW_AT_BORLAND_property_read) {
    local_c = 0;
  }
  else if (Attribute == DW_AT_BORLAND_property_write) {
    local_c = 0;
  }
  else if (Attribute == DW_AT_BORLAND_property_implements) {
    local_c = 0;
  }
  else if (Attribute == DW_AT_BORLAND_property_index) {
    local_c = 0;
  }
  else if (Attribute == DW_AT_BORLAND_property_default) {
    local_c = 0;
  }
  else if (Attribute == DW_AT_BORLAND_Delphi_unit) {
    local_c = 0;
  }
  else if (Attribute == DW_AT_BORLAND_Delphi_class) {
    local_c = 0;
  }
  else if (Attribute == DW_AT_BORLAND_Delphi_record) {
    local_c = 0;
  }
  else if (Attribute == DW_AT_BORLAND_Delphi_metaclass) {
    local_c = 0;
  }
  else if (Attribute == DW_AT_BORLAND_Delphi_constructor) {
    local_c = 0;
  }
  else if (Attribute == DW_AT_BORLAND_Delphi_destructor) {
    local_c = 0;
  }
  else if (Attribute == DW_AT_BORLAND_Delphi_anonymous_method) {
    local_c = 0;
  }
  else if (Attribute == DW_AT_BORLAND_Delphi_interface) {
    local_c = 0;
  }
  else if (Attribute == DW_AT_BORLAND_Delphi_ABI) {
    local_c = 0;
  }
  else if (Attribute == DW_AT_BORLAND_Delphi_return) {
    local_c = 0;
  }
  else if (Attribute == DW_AT_BORLAND_Delphi_frameptr) {
    local_c = 0;
  }
  else if (Attribute == DW_AT_BORLAND_closure) {
    local_c = 0;
  }
  else if (Attribute == DW_AT_LLVM_include_path) {
    local_c = 0;
  }
  else if (Attribute == DW_AT_LLVM_config_macros) {
    local_c = 0;
  }
  else if (Attribute == DW_AT_LLVM_isysroot) {
    local_c = 0;
  }
  else if (Attribute == DW_AT_LLVM_tag_offset) {
    local_c = 0;
  }
  else if (Attribute == DW_AT_APPLE_optimized) {
    local_c = 0;
  }
  else if (Attribute == DW_AT_APPLE_flags) {
    local_c = 0;
  }
  else if (Attribute == DW_AT_APPLE_isa) {
    local_c = 0;
  }
  else if (Attribute == DW_AT_APPLE_block) {
    local_c = 0;
  }
  else if (Attribute == DW_AT_APPLE_major_runtime_vers) {
    local_c = 0;
  }
  else if (Attribute == DW_AT_APPLE_runtime_class) {
    local_c = 0;
  }
  else if (Attribute == DW_AT_APPLE_omit_frame_ptr) {
    local_c = 0;
  }
  else if (Attribute == DW_AT_APPLE_property_name) {
    local_c = 0;
  }
  else if (Attribute == DW_AT_APPLE_property_getter) {
    local_c = 0;
  }
  else if (Attribute == DW_AT_APPLE_property_setter) {
    local_c = 0;
  }
  else if (Attribute == DW_AT_APPLE_property_attribute) {
    local_c = 0;
  }
  else if (Attribute == DW_AT_APPLE_objc_complete_type) {
    local_c = 0;
  }
  else if (Attribute == DW_AT_APPLE_property) {
    local_c = 0;
  }
  else {
    local_c = 0;
  }
  return local_c;
}

Assistant:

unsigned llvm::dwarf::AttributeVersion(dwarf::Attribute Attribute) {
  switch (Attribute) {
  default:
    return 0;
#define HANDLE_DW_AT(ID, NAME, VERSION, VENDOR)                                \
  case DW_AT_##NAME:                                                           \
    return VERSION;
#include "llvm/BinaryFormat/Dwarf.def"
  }
}